

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,Assignment *e)

{
  anon_class_16_2_d7082910_conflict1 local_48;
  function<void_()> local_38;
  Assignment *local_18;
  Assignment *e_local;
  DefaultEvaluator *this_local;
  
  local_48.e = &local_18;
  local_48.this = this;
  local_18 = e;
  e_local = (Assignment *)this;
  std::function<void()>::
  function<ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::Assignment*)::__0,void>
            ((function<void()> *)&local_38,&local_48);
  no_echo(&local_38);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::Assignment *e) {
    no_echo([&]{
        // Evaluate the expression
        reset_return_block();
        e->get_value()->accept(this);

        // Get the result as a unique pointer and move it to the block scope
        auto result {get_owned_return_block()};

        // Obtain the correct object by traversing the name structure
        std::string field_name;
        auto target_object { navigate_object_tree(e->get_parent(), e->get_name(), field_name) };

        target_object->set_variable(field_name, std::move(result), false);
    });
}